

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<int>::emplaceRealloc<int_const&>
          (SmallVectorBase<int> *this,pointer pos,int *args)

{
  ulong uVar1;
  pointer __src;
  size_type sVar2;
  pointer __dest;
  pointer piVar3;
  long lVar4;
  size_t __n;
  ulong uVar5;
  
  if (this->len != 0x1fffffffffffffff) {
    uVar5 = this->len + 1;
    uVar1 = this->cap;
    if (uVar5 < uVar1 * 2) {
      uVar5 = uVar1 * 2;
    }
    if (0x1fffffffffffffff - uVar1 < uVar1) {
      uVar5 = 0x1fffffffffffffff;
    }
    lVar4 = (long)pos - (long)this->data_;
    __dest = (pointer)operator_new(uVar5 * 4);
    piVar3 = (pointer)((long)__dest + lVar4);
    *(int *)((long)__dest + lVar4) = *args;
    __src = this->data_;
    sVar2 = this->len;
    __n = (long)__src + (sVar2 * 4 - (long)pos);
    if (__n == 0) {
      if (sVar2 != 0) {
        memmove(__dest,__src,sVar2 << 2);
      }
    }
    else {
      if (__src != pos) {
        memmove(__dest,__src,(long)pos - (long)__src);
      }
      memcpy(piVar3 + 1,pos,__n);
    }
    if (__src != (pointer)this->firstElement) {
      operator_delete(__src);
    }
    this->len = this->len + 1;
    this->cap = uVar5;
    this->data_ = __dest;
    return piVar3;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}